

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

uint FSE_minTableLog(size_t srcSize,uint maxSymbolValue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = BIT_highbit32((U32)srcSize);
  uVar3 = BIT_highbit32(maxSymbolValue);
  if (1 < srcSize) {
    uVar1 = uVar3 + 2;
    if (uVar2 + 1 < uVar3 + 2) {
      uVar1 = uVar2 + 1;
    }
    return uVar1;
  }
  __assert_fail("srcSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x167c,"unsigned int FSE_minTableLog(size_t, unsigned int)");
}

Assistant:

static unsigned FSE_minTableLog(size_t srcSize, unsigned maxSymbolValue)
{
    U32 minBitsSrc = BIT_highbit32((U32)(srcSize)) + 1;
    U32 minBitsSymbols = BIT_highbit32(maxSymbolValue) + 2;
    U32 minBits = minBitsSrc < minBitsSymbols ? minBitsSrc : minBitsSymbols;
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    return minBits;
}